

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictive_info.c
# Opt level: O3

double inform_predictive_info
                 (int *series,size_t n,size_t m,int b,size_t kpast,size_t kfuture,inform_error *err)

{
  ulong uVar1;
  long lVar2;
  _Bool _Var3;
  uint32_t *__ptr;
  ulong uVar4;
  long lVar5;
  int iVar6;
  int *piVar7;
  int *piVar8;
  int iVar9;
  size_t sVar10;
  size_t sVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  size_t sVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  inform_dist futures;
  inform_dist histories;
  inform_dist states;
  inform_dist local_78;
  inform_dist local_60;
  inform_dist local_48;
  
  _Var3 = check_arguments(series,n,m,b,kpast,kfuture,err);
  dVar16 = NAN;
  if (!_Var3) {
    auVar18._8_4_ = (int)(kpast >> 0x20);
    auVar18._0_8_ = kpast;
    auVar18._12_4_ = 0x45300000;
    dVar16 = pow((double)b,
                 (auVar18._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)kpast) - 4503599627370496.0));
    uVar14 = (long)(dVar16 - 9.223372036854776e+18) & (long)dVar16 >> 0x3f | (long)dVar16;
    auVar17._8_4_ = (int)(kfuture >> 0x20);
    auVar17._0_8_ = kfuture;
    auVar17._12_4_ = 0x45300000;
    dVar16 = pow((double)b,
                 (auVar17._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)kfuture) - 4503599627370496.0));
    uVar4 = (long)(dVar16 - 9.223372036854776e+18) & (long)dVar16 >> 0x3f | (long)dVar16;
    sVar15 = uVar4 * uVar14;
    __ptr = (uint32_t *)calloc(uVar4 + uVar14 + sVar15,4);
    if (__ptr == (uint32_t *)0x0) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
      dVar16 = NAN;
    }
    else {
      uVar1 = kfuture + kpast;
      local_78.counts = ((m - uVar1) + 1) * n;
      local_60.histogram = __ptr + sVar15;
      local_78.histogram = local_60.histogram + uVar14;
      if (n != 0) {
        piVar7 = series + kpast;
        piVar8 = series + kfuture + kpast;
        sVar11 = 0;
        do {
          iVar12 = 1;
          iVar6 = 0;
          iVar13 = 1;
          if (kpast != 0) {
            sVar10 = 0;
            iVar6 = 0;
            do {
              iVar13 = iVar13 * b;
              iVar6 = iVar6 * b + series[sVar10];
              sVar10 = sVar10 + 1;
            } while (kpast != sVar10);
          }
          iVar9 = 0;
          if (kpast < uVar1) {
            iVar12 = 1;
            sVar10 = 0;
            iVar9 = 0;
            do {
              iVar12 = iVar12 * b;
              iVar9 = iVar9 * b + piVar7[sVar10];
              sVar10 = sVar10 + 1;
            } while (kfuture != sVar10);
          }
          lVar5 = 0;
          do {
            __ptr[iVar6 * iVar12 + iVar9] = __ptr[iVar6 * iVar12 + iVar9] + 1;
            local_60.histogram[iVar6] = local_60.histogram[iVar6] + 1;
            local_78.histogram[iVar9] = local_78.histogram[iVar9] + 1;
            iVar6 = (iVar6 * b + piVar7[lVar5]) - series[lVar5] * iVar13;
            iVar9 = (iVar9 * b + piVar8[lVar5]) - piVar7[lVar5] * iVar12;
            lVar2 = uVar1 + lVar5;
            lVar5 = lVar5 + 1;
          } while (lVar2 + 1U <= m);
          sVar11 = sVar11 + 1;
          series = series + m;
          piVar7 = piVar7 + m;
          piVar8 = piVar8 + m;
        } while (sVar11 != n);
      }
      local_78.size = uVar4;
      local_60.size = uVar14;
      local_60.counts = local_78.counts;
      local_48.histogram = __ptr;
      local_48.size = sVar15;
      local_48.counts = local_78.counts;
      dVar16 = inform_shannon_mi(&local_48,&local_60,&local_78,2.0);
      free(__ptr);
    }
  }
  return dVar16;
}

Assistant:

double inform_predictive_info(int const *series, size_t n, size_t m, int b,
    size_t kpast, size_t kfuture, inform_error *err)
{
    if (check_arguments(series, n, m, b, kpast, kfuture, err)) return NAN;

    size_t const N = n * (m - kpast - kfuture + 1);

    size_t const histories_size = (size_t) pow((double) b, (double) kpast);
    size_t const futures_size = (size_t) pow((double) b, (double) kfuture);
    size_t const states_size = histories_size * futures_size;
    size_t const total_size = states_size + histories_size + futures_size;

    uint32_t *data = calloc(total_size, sizeof(uint32_t));
    if (data == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NAN);
    }

    inform_dist states    = { data, states_size, N };
    inform_dist histories = { data + states_size, histories_size, N };
    inform_dist futures   = { data + states_size + histories_size, futures_size, N };

    accumulate_observations(series, n, m, b, kpast, kfuture, &states,
        &histories, &futures);

    double pi = inform_shannon_mi(&states, &histories, &futures, 2.0);

    free(data);

    return pi;
}